

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,false,true,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  sel_t sVar9;
  long lVar10;
  ulong uVar11;
  int64_t *piVar12;
  idx_t iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    iVar13 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar13 = 0;
    uVar5 = 0;
    uVar8 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar4 = 0xffffffffffffffff;
      }
      else {
        uVar4 = puVar1[uVar5];
      }
      uVar11 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar11 = count;
      }
      uVar17 = uVar11;
      if (uVar4 != 0) {
        uVar17 = uVar8;
        if (uVar4 == 0xffffffffffffffff) {
          if (uVar8 < uVar11) {
            lVar14 = rdata->micros;
            psVar2 = sel->sel_vector;
            lVar6 = (long)rdata->days + lVar14 / 86400000000;
            lVar16 = lVar6 % 0x1e;
            lVar6 = (long)rdata->months + lVar6 / 0x1e;
            psVar3 = true_sel->sel_vector;
            piVar12 = &ldata[uVar8].micros;
            do {
              uVar8 = uVar17;
              if (psVar2 != (sel_t *)0x0) {
                uVar8 = (ulong)psVar2[uVar17];
              }
              lVar7 = (long)*(int32_t *)((long)piVar12 + -4) + *piVar12 / 86400000000;
              lVar10 = lVar7 % 0x1e;
              lVar7 = (long)((interval_t *)(piVar12 + -1))->months + lVar7 / 0x1e;
              uVar4 = 1;
              if (lVar7 <= lVar6) {
                if (lVar7 < lVar6) {
                  uVar4 = 0;
                }
                else if (lVar10 <= lVar16) {
                  uVar4 = (ulong)(lVar14 % 86400000000 < *piVar12 % 86400000000 && lVar16 <= lVar10)
                  ;
                }
              }
              psVar3[iVar13] = (sel_t)uVar8;
              iVar13 = iVar13 + uVar4;
              uVar17 = uVar17 + 1;
              piVar12 = piVar12 + 2;
            } while (uVar11 != uVar17);
          }
        }
        else if (uVar8 < uVar11) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          piVar12 = &ldata[uVar8].micros;
          uVar17 = 0;
          do {
            if (psVar2 == (sel_t *)0x0) {
              sVar9 = (int)uVar8 + (int)uVar17;
            }
            else {
              sVar9 = psVar2[uVar8 + uVar17];
            }
            if ((uVar4 >> (uVar17 & 0x3f) & 1) == 0) {
              uVar15 = 0;
            }
            else {
              lVar14 = (long)*(int32_t *)((long)piVar12 + -4) + *piVar12 / 86400000000;
              lVar7 = lVar14 % 0x1e;
              lVar6 = (long)((interval_t *)(piVar12 + -1))->months + lVar14 / 0x1e;
              lVar16 = (long)rdata->days + rdata->micros / 86400000000;
              lVar14 = lVar16 % 0x1e;
              lVar16 = (long)rdata->months + lVar16 / 0x1e;
              uVar15 = 1;
              if (lVar6 <= lVar16) {
                if (lVar6 < lVar16) {
                  uVar15 = 0;
                }
                else if (lVar7 <= lVar14) {
                  uVar15 = (ulong)(rdata->micros % 86400000000 < *piVar12 % 86400000000 &&
                                  lVar14 <= lVar7);
                }
              }
            }
            psVar3[iVar13] = sVar9;
            iVar13 = uVar15 + iVar13;
            uVar17 = uVar17 + 1;
            piVar12 = piVar12 + 2;
          } while ((uVar8 - uVar11) + uVar17 != 0);
          uVar17 = uVar8 + uVar17;
        }
      }
      uVar5 = uVar5 + 1;
      uVar8 = uVar17;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return iVar13;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}